

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_setup_connection(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  curl_trc_feat *pcVar2;
  FILEPROTO *pFVar3;
  undefined8 uVar4;
  
  puVar1 = &(conn->bits).field_0x3;
  *puVar1 = *puVar1 & 0xf7;
  pFVar3 = (FILEPROTO *)(*Curl_ccalloc)(1,0x30);
  (data->req).p.file = pFVar3;
  uVar4 = 0x1b;
  if (pFVar3 != (FILEPROTO *)0x0) {
    uVar4 = 0;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"smtp_setup_connection() -> %d",uVar4);
  }
  return (CURLcode)uVar4;
}

Assistant:

static CURLcode smtp_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  CURLcode result;

  /* Clear the TLS upgraded flag */
  conn->bits.tls_upgraded = FALSE;

  /* Initialise the SMTP layer */
  result = smtp_init(data);
  CURL_TRC_SMTP(data, "smtp_setup_connection() -> %d", result);
  return result;
}